

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

bool __thiscall
presolve::HPresolve::okSetInput
          (HPresolve *this,HighsMipSolver *mipsolver,HighsInt presolve_reduction_limit)

{
  HighsLp *pHVar1;
  bool bVar2;
  pointer pHVar3;
  HighsMipSolver *in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000058;
  vector<double,_std::allocator<double>_> *in_stack_00000060;
  HighsTimer *in_stack_00000188;
  HighsInt in_stack_00000194;
  HighsOptions *in_stack_00000198;
  HighsLp *in_stack_000001a0;
  HPresolve *in_stack_000001a8;
  HighsLp *in_stack_ffffffffffffffb8;
  HighsLp *in_stack_ffffffffffffffc0;
  
  *(HighsMipSolver **)(in_RDI + 0x18) = in_RSI;
  *(undefined8 *)(in_RDI + 0x610) = 1000;
  *(undefined4 *)(in_RDI + 0x618) = 0;
  *(undefined4 *)(in_RDI + 0x61c) = 0;
  HighsMipSolver::numCol(in_RSI);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::assign
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_ffffffffffffffc0,
             (size_type)in_stack_ffffffffffffffb8,(value_type_conflict8 *)0x6ebde2);
  pHVar1 = in_RSI->model_;
  pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x6ebe01);
  if (pHVar1 == &pHVar3->presolvedModel) {
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x6ebe82)
    ;
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x6ebea3)
    ;
    std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000060,in_stack_00000058);
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x6ebecb)
    ;
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x6ebeed)
    ;
    std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000060,in_stack_00000058);
  }
  else {
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x6ebe34)
    ;
    HighsLp::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x6ebe59);
    in_RSI->model_ = &pHVar3->presolvedModel;
  }
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x6ebf16);
  bVar2 = okSetInput(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000194,
                     in_stack_00000188);
  return bVar2;
}

Assistant:

bool HPresolve::okSetInput(HighsMipSolver& mipsolver,
                           const HighsInt presolve_reduction_limit) {
  this->mipsolver = &mipsolver;

  probingContingent = 1000;
  probingNumDelCol = 0;
  numProbed = 0;
  numProbes.assign(mipsolver.numCol(), 0);

  if (mipsolver.model_ != &mipsolver.mipdata_->presolvedModel) {
    mipsolver.mipdata_->presolvedModel = *mipsolver.model_;
    mipsolver.model_ = &mipsolver.mipdata_->presolvedModel;
  } else {
    mipsolver.mipdata_->presolvedModel.col_lower_ =
        mipsolver.mipdata_->domain.col_lower_;
    mipsolver.mipdata_->presolvedModel.col_upper_ =
        mipsolver.mipdata_->domain.col_upper_;
  }

  return okSetInput(mipsolver.mipdata_->presolvedModel, *mipsolver.options_mip_,
                    presolve_reduction_limit, &mipsolver.timer_);
}